

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void vmaEndDefragmentation
               (VmaAllocator allocator,VmaDefragmentationContext context,
               VmaDefragmentationStats *pStats)

{
  VmaDefragmentationContext_T *in_RDX;
  VmaAllocator in_RSI;
  
  if (in_RDX != (VmaDefragmentationContext_T *)0x0) {
    VmaDefragmentationContext_T::GetStats
              ((VmaDefragmentationContext_T *)in_RSI,(VmaDefragmentationStats *)in_RDX);
  }
  vma_delete<VmaDefragmentationContext_T>(in_RSI,in_RDX);
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaEndDefragmentation(
    VmaAllocator allocator,
    VmaDefragmentationContext context,
    VmaDefragmentationStats* pStats)
{
    VMA_ASSERT(allocator && context);

    VMA_DEBUG_LOG("vmaEndDefragmentation");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    if (pStats)
        context->GetStats(*pStats);
    vma_delete(allocator, context);
}